

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::DictionaryFeatureType::MergePartialFromCodedStream
          (DictionaryFeatureType *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  Int64FeatureType *this_00;
  ulong extraout_RAX;
  StringFeatureType *this_01;
  ulong extraout_RAX_00;
  ulong uVar7;
  int local_38;
  int local_34;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001f214d;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001f214d:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_001f21e7:
      iVar6 = 7;
      if ((uVar4 & 7) != 4 && uVar4 != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
        if (bVar3) goto LAB_001f220c;
        iVar6 = 6;
      }
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar7 != '\x12') goto LAB_001f21e7;
        if (this->_oneof_case_[0] != 2) {
          clear_KeyType(this);
          this->_oneof_case_[0] = 2;
          this_01 = (StringFeatureType *)operator_new(0x18);
          StringFeatureType::StringFeatureType(this_01);
          (this->KeyType_).stringkeytype_ = this_01;
        }
        MergePartialFromCodedStream();
        iVar6 = local_38;
        if ((extraout_RAX_00 & 1) == 0) goto LAB_001f220c;
      }
      else {
        if ((uVar5 != 1) || ((char)uVar7 != '\n')) goto LAB_001f21e7;
        if (this->_oneof_case_[0] != 1) {
          clear_KeyType(this);
          this->_oneof_case_[0] = 1;
          this_00 = (Int64FeatureType *)operator_new(0x18);
          Int64FeatureType::Int64FeatureType(this_00);
          (this->KeyType_).int64keytype_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar6 = local_34;
        if ((extraout_RAX & 1) != 0) goto LAB_001f220e;
LAB_001f220c:
        iVar6 = 0;
      }
    }
LAB_001f220e:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool DictionaryFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.DictionaryFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Int64FeatureType int64KeyType = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64keytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringFeatureType stringKeyType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringkeytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.DictionaryFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.DictionaryFeatureType)
  return false;
#undef DO_
}